

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowDebugLogWindow(bool *p_open)

{
  char *text_end;
  ImGuiDebugLogFlags *flags;
  ImRect *r_min;
  float fVar1;
  ImVec2 IVar2;
  uint uVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  char *text;
  ImGuiContext *pIVar12;
  char *text_end_00;
  ImGuiID id;
  ImGuiContext *local_a0;
  ImGuiTextIndex *local_98;
  ImVec2 *local_90;
  ImGuiListClipper clipper;
  float local_68;
  float fStack_64;
  float local_48;
  
  pIVar12 = GImGui;
  uVar3 = (GImGui->NextWindowData).Flags;
  if ((uVar3 & 2) == 0) {
    fVar1 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar3 | 2;
    (pIVar12->NextWindowData).SizeVal.x = 0.0;
    (pIVar12->NextWindowData).SizeVal.y = fVar1 * 12.0;
    (pIVar12->NextWindowData).SizeCond = 4;
  }
  bVar8 = Begin("Dear ImGui Debug Log",p_open,0);
  pIVar7 = GImGui;
  if ((bVar8) &&
     (GImGui->CurrentWindow->WriteAccessed = true, pIVar7->CurrentWindow->BeginCount < 2)) {
    AlignTextToFramePadding();
    Text("Log events:");
    SameLine(0.0,-1.0);
    flags = &pIVar12->DebugLogFlags;
    CheckboxFlags("All",flags,0x3f);
    SameLine(0.0,-1.0);
    CheckboxFlags("ActiveId",flags,1);
    SameLine(0.0,-1.0);
    CheckboxFlags("Focus",flags,2);
    SameLine(0.0,-1.0);
    CheckboxFlags("Popup",flags,4);
    SameLine(0.0,-1.0);
    CheckboxFlags("Nav",flags,8);
    SameLine(0.0,-1.0);
    CheckboxFlags("Clipper",flags,0x10);
    SameLine(0.0,-1.0);
    CheckboxFlags("IO",flags,0x20);
    bVar8 = SmallButton("Clear");
    if (bVar8) {
      ImVector<char>::clear(&(pIVar12->DebugLogBuf).Buf);
      ImGuiTextIndex::clear(&pIVar12->DebugLogIndex);
    }
    SameLine(0.0,-1.0);
    bVar8 = SmallButton("Copy");
    if (bVar8) {
      pcVar11 = (pIVar12->DebugLogBuf).Buf.Data;
      if (pcVar11 == (char *)0x0) {
        pcVar11 = ImGuiTextBuffer::EmptyString;
      }
      SetClipboardText(pcVar11);
    }
    clipper.DisplayStart = 0;
    clipper.DisplayEnd = 0;
    BeginChild("##log",(ImVec2 *)&clipper,true,0xc000);
    clipper.DisplayStart = 0;
    clipper.DisplayEnd = 0;
    clipper.StartPosY = 0.0;
    clipper._20_4_ = 0;
    clipper.TempData = (void *)0x0;
    clipper.ItemsCount = -1;
    clipper.ItemsHeight = 0.0;
    ImGuiListClipper::Begin(&clipper,(pIVar12->DebugLogIndex).LineOffsets.Size,-1.0);
    local_98 = &pIVar12->DebugLogIndex;
    r_min = &(pIVar12->LastItemData).Rect;
    local_90 = &(pIVar12->LastItemData).Rect.Max;
    local_a0 = pIVar12;
    while (bVar8 = ImGuiListClipper::Step(&clipper), bVar8) {
      for (lVar10 = (long)clipper.DisplayStart; lVar10 < clipper.DisplayEnd; lVar10 = lVar10 + 1) {
        pcVar11 = (pIVar12->DebugLogBuf).Buf.Data;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = ImGuiTextBuffer::EmptyString;
        }
        text = pcVar11 + (pIVar12->DebugLogIndex).LineOffsets.Data[lVar10];
        pcVar11 = ImGuiTextIndex::get_line_end(local_98,pcVar11,(int)lVar10);
        TextUnformatted(text,pcVar11);
        IVar2 = r_min->Min;
        bVar8 = IsItemHovered(0);
        if (bVar8) {
          fStack_64 = IVar2.y;
          for (text_end_00 = text; text_end_00 < pcVar11 + -10; text_end_00 = text_end_00 + 1) {
            id = 0;
            if (((*text_end_00 == '0') && ((byte)(text_end_00[1] | 0x20U) == 0x78)) &&
               (iVar9 = __isoc99_sscanf(text_end_00 + 2,"%X",&id), iVar9 == 1)) {
              IVar4 = CalcTextSize(text,text_end_00,false,-1.0);
              text_end = text_end_00 + 10;
              IVar5 = CalcTextSize(text_end_00,text_end,false,-1.0);
              local_68 = IVar2.x;
              local_48 = IVar4.x;
              IVar6.y = fStack_64 + 0.0;
              IVar6.x = local_68 + local_48;
              r_min->Min = IVar6;
              IVar4.y = IVar5.y + fStack_64;
              IVar4.x = local_48 + IVar5.x + local_68;
              *local_90 = IVar4;
              bVar8 = IsMouseHoveringRect(&r_min->Min,local_90,true);
              text_end_00 = text_end;
              if (bVar8) {
                DebugLocateItemOnHover(id);
              }
            }
          }
        }
        pIVar12 = local_a0;
      }
    }
    if ((GImGui->CurrentWindow->ScrollMax).y <= (GImGui->CurrentWindow->Scroll).y) {
      SetScrollHereY(1.0);
    }
    EndChild();
    End();
    ImGuiListClipper::~ImGuiListClipper(&clipper);
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDebugLogWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 12.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Debug Log", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    AlignTextToFramePadding();
    Text("Log events:");
    SameLine(); CheckboxFlags("All", &g.DebugLogFlags, ImGuiDebugLogFlags_EventMask_);
    SameLine(); CheckboxFlags("ActiveId", &g.DebugLogFlags, ImGuiDebugLogFlags_EventActiveId);
    SameLine(); CheckboxFlags("Focus", &g.DebugLogFlags, ImGuiDebugLogFlags_EventFocus);
    SameLine(); CheckboxFlags("Popup", &g.DebugLogFlags, ImGuiDebugLogFlags_EventPopup);
    SameLine(); CheckboxFlags("Nav", &g.DebugLogFlags, ImGuiDebugLogFlags_EventNav);
    SameLine(); CheckboxFlags("Clipper", &g.DebugLogFlags, ImGuiDebugLogFlags_EventClipper);
    SameLine(); CheckboxFlags("IO", &g.DebugLogFlags, ImGuiDebugLogFlags_EventIO);

    if (SmallButton("Clear"))
    {
        g.DebugLogBuf.clear();
        g.DebugLogIndex.clear();
    }
    SameLine();
    if (SmallButton("Copy"))
        SetClipboardText(g.DebugLogBuf.c_str());
    BeginChild("##log", ImVec2(0.0f, 0.0f), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar);

    ImGuiListClipper clipper;
    clipper.Begin(g.DebugLogIndex.size());
    while (clipper.Step())
        for (int line_no = clipper.DisplayStart; line_no < clipper.DisplayEnd; line_no++)
        {
            const char* line_begin = g.DebugLogIndex.get_line_begin(g.DebugLogBuf.c_str(), line_no);
            const char* line_end = g.DebugLogIndex.get_line_end(g.DebugLogBuf.c_str(), line_no);
            TextUnformatted(line_begin, line_end);
            ImRect text_rect = g.LastItemData.Rect;
            if (IsItemHovered())
                for (const char* p = line_begin; p < line_end - 10; p++)
                {
                    ImGuiID id = 0;
                    if (p[0] != '0' || (p[1] != 'x' && p[1] != 'X') || sscanf(p + 2, "%X", &id) != 1)
                        continue;
                    ImVec2 p0 = CalcTextSize(line_begin, p);
                    ImVec2 p1 = CalcTextSize(p, p + 10);
                    g.LastItemData.Rect = ImRect(text_rect.Min + ImVec2(p0.x, 0.0f), text_rect.Min + ImVec2(p0.x + p1.x, p1.y));
                    if (IsMouseHoveringRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, true))
                        DebugLocateItemOnHover(id);
                    p += 10;
                }
        }
    if (GetScrollY() >= GetScrollMaxY())
        SetScrollHereY(1.0f);
    EndChild();

    End();
}